

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

void __thiscall
FlowGraph::BuildLoop(FlowGraph *this,BasicBlock *headBlock,BasicBlock *tailBlock,Loop *parentLoop)

{
  code *pcVar1;
  bool bVar2;
  ImplicitCallFlags newFlags;
  ScriptContext *pSVar3;
  ThreadContext *this_00;
  Instr *this_01;
  LabelInstr *pLVar4;
  undefined4 *puVar5;
  Func *pFVar6;
  JitArenaAllocator *pJVar7;
  Loop *pLVar8;
  PageAllocator *pageAllocator;
  BasicBlock *pBVar9;
  ProfiledLabelInstr *pPVar10;
  JITTimeProfileInfo *pJVar11;
  LabelInstr *firstInstr;
  undefined1 local_f0 [8];
  NoRecoverMemoryJitArenaAllocator tempAlloc;
  TrackAllocData local_58;
  Loop *local_30;
  Loop *loop;
  Loop *parentLoop_local;
  BasicBlock *tailBlock_local;
  BasicBlock *headBlock_local;
  FlowGraph *this_local;
  
  loop = parentLoop;
  parentLoop_local = (Loop *)tailBlock;
  tailBlock_local = headBlock;
  headBlock_local = (BasicBlock *)this;
  bVar2 = Func::IsBackgroundJIT(this->func);
  if (!bVar2) {
    pSVar3 = Func::GetScriptContext(this->func);
    this_00 = Js::ScriptContext::GetThreadContext(pSVar3);
    pSVar3 = Func::GetScriptContext(this->func);
    ThreadContext::ProbeStackNoDispose(this_00,0xc00,pSVar3,(PVOID)0x0);
  }
  if (*(uint *)&parentLoop_local[1].next < tailBlock_local->number) {
    *(ushort *)&tailBlock_local->field_0x18 = *(ushort *)&tailBlock_local->field_0x18 & 0xfffb;
    this_01 = BasicBlock::GetFirstInstr(tailBlock_local);
    pLVar4 = IR::Instr::AsLabelInstr(this_01);
    pLVar4->field_0x78 = pLVar4->field_0x78 & 0xfe;
  }
  else {
    if ((*(ushort *)&tailBlock_local->field_0x18 >> 2 & 1) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0x4ff,"(headBlock->isLoopHeader)","headBlock->isLoopHeader");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    pFVar6 = GetFunc(this);
    pJVar7 = pFVar6->m_alloc;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_58,(type_info *)&Loop::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
               ,0x500);
    pJVar7 = (JitArenaAllocator *)
             Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            pJVar7,&local_58);
    tempAlloc.super_JitArenaAllocator.bvFreeList =
         (BVSparseNode *)Memory::JitArenaAllocator::AllocZero;
    pLVar8 = (Loop *)new<Memory::JitArenaAllocator>(0x1d8,pJVar7,0x4e9be0);
    pFVar6 = GetFunc(this);
    pJVar7 = pFVar6->m_alloc;
    pFVar6 = GetFunc(this);
    Loop::Loop(pLVar8,pJVar7,pFVar6);
    pLVar8->next = this->loopList;
    this->loopList = pLVar8;
    tailBlock_local->loop = pLVar8;
    pLVar8->headBlock = tailBlock_local;
    pLVar8->int32SymsOnEntry = (BVSparse<Memory::JitArenaAllocator> *)0x0;
    pLVar8->lossyInt32SymsOnEntry = (BVSparse<Memory::JitArenaAllocator> *)0x0;
    if ((loop != (Loop *)0x0) && (loop->headBlock->number < pLVar8->headBlock->number)) {
      pLVar8->parent = loop;
      *(ushort *)&loop->field_0x178 = *(ushort *)&loop->field_0x178 & 0xfeff;
    }
    *(ushort *)&pLVar8->field_0x178 = *(ushort *)&pLVar8->field_0x178 & 0xfffd;
    *(ushort *)&pLVar8->field_0x178 = *(ushort *)&pLVar8->field_0x178 & 0xfffb;
    pLVar8->memOpInfo = (MemOpInfo *)0x0;
    *(ushort *)&pLVar8->field_0x178 = *(ushort *)&pLVar8->field_0x178 | 0x400;
    local_30 = pLVar8;
    pageAllocator =
         Memory::ArenaData::GetPageAllocator
                   (&(this->func->m_alloc->super_ArenaAllocator).
                     super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                     super_ArenaData);
    Memory::NoRecoverMemoryJitArenaAllocator::NoRecoverMemoryJitArenaAllocator
              ((NoRecoverMemoryJitArenaAllocator *)local_f0,L"BE-LoopBuilder",pageAllocator,
               Js::Throw::OutOfMemory);
    WalkLoopBlocks(this,(BasicBlock *)parentLoop_local,local_30,(JitArenaAllocator *)local_f0);
    pBVar9 = Loop::GetHeadBlock(local_30);
    if (pBVar9 != tailBlock_local) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0x517,"(loop->GetHeadBlock() == headBlock)",
                         "loop->GetHeadBlock() == headBlock");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    pLVar4 = Loop::GetLoopTopInstr(local_30);
    IR::LabelInstr::SetLoop(pLVar4,local_30);
    bVar2 = IR::Instr::IsProfiledLabelInstr(&pLVar4->super_Instr);
    pLVar8 = local_30;
    if (bVar2) {
      pPVar10 = IR::Instr::AsProfiledLabelInstr(&pLVar4->super_Instr);
      Loop::SetImplicitCallFlags(pLVar8,pPVar10->loopImplicitCallFlags);
      bVar2 = Func::HasProfileInfo(this->func);
      if (bVar2) {
        pJVar11 = Func::GetReadOnlyProfileInfo(this->func);
        bVar2 = JITTimeProfileInfo::IsLoopImplicitCallInfoDisabled(pJVar11);
        pLVar8 = local_30;
        if (bVar2) {
          pJVar11 = Func::GetReadOnlyProfileInfo(this->func);
          newFlags = JITTimeProfileInfo::GetImplicitCallFlags(pJVar11);
          Loop::SetImplicitCallFlags(pLVar8,newFlags);
        }
      }
      pLVar8 = local_30;
      pPVar10 = IR::Instr::AsProfiledLabelInstr(&pLVar4->super_Instr);
      Loop::SetLoopFlags(pLVar8,pPVar10->loopFlags);
    }
    else {
      Loop::SetImplicitCallFlags(local_30,ImplicitCall_All);
    }
    Memory::NoRecoverMemoryJitArenaAllocator::~NoRecoverMemoryJitArenaAllocator
              ((NoRecoverMemoryJitArenaAllocator *)local_f0);
  }
  return;
}

Assistant:

void
FlowGraph::BuildLoop(BasicBlock *headBlock, BasicBlock *tailBlock, Loop *parentLoop)
{
    // This function is recursive, so when jitting in the foreground, probe the stack
    if(!func->IsBackgroundJIT())
    {
        PROBE_STACK_NO_DISPOSE(func->GetScriptContext(), Js::Constants::MinStackDefault);
    }

    if (tailBlock->number < headBlock->number)
    {
        // Not a loop.  We didn't see any back-edge.
        headBlock->isLoopHeader = false;
        headBlock->GetFirstInstr()->AsLabelInstr()->m_isLoopTop = false;
        return;
    }

    Assert(headBlock->isLoopHeader);
    Loop *loop = JitAnewZ(this->GetFunc()->m_alloc, Loop, this->GetFunc()->m_alloc, this->GetFunc());
    loop->next = this->loopList;
    this->loopList = loop;
    headBlock->loop = loop;
    loop->headBlock = headBlock;
    loop->int32SymsOnEntry = nullptr;
    loop->lossyInt32SymsOnEntry = nullptr;

    // If parentLoop is a parent of loop, it's headBlock better appear first.
    if (parentLoop && loop->headBlock->number > parentLoop->headBlock->number)
    {
        loop->parent = parentLoop;
        parentLoop->isLeaf = false;
    }
    loop->hasDeadStoreCollectionPass = false;
    loop->hasDeadStorePrepass = false;
    loop->memOpInfo = nullptr;
    loop->doMemOp = true;

    NoRecoverMemoryJitArenaAllocator tempAlloc(_u("BE-LoopBuilder"), this->func->m_alloc->GetPageAllocator(), Js::Throw::OutOfMemory);

    WalkLoopBlocks(tailBlock, loop, &tempAlloc);

    Assert(loop->GetHeadBlock() == headBlock);

    IR::LabelInstr * firstInstr = loop->GetLoopTopInstr();

    firstInstr->SetLoop(loop);

    if (firstInstr->IsProfiledLabelInstr())
    {
        loop->SetImplicitCallFlags(firstInstr->AsProfiledLabelInstr()->loopImplicitCallFlags);
        if (this->func->HasProfileInfo() && this->func->GetReadOnlyProfileInfo()->IsLoopImplicitCallInfoDisabled())
        {
            loop->SetImplicitCallFlags(this->func->GetReadOnlyProfileInfo()->GetImplicitCallFlags());
        }
        loop->SetLoopFlags(firstInstr->AsProfiledLabelInstr()->loopFlags);
    }
    else
    {
        // Didn't collect profile information, don't do optimizations
        loop->SetImplicitCallFlags(Js::ImplicitCall_All);
    }
}